

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O0

void __thiscall
MemPlumberInternal::checkLeaks
          (MemPlumberInternal *this,size_t *memLeakCount,uint64_t *memLeakSize,bool verbose,
          char *fileDumperName,bool append)

{
  new_ptr_list_t *local_50;
  new_ptr_list_t *metaDataBucketLinkedListElement;
  FILE *pFStack_40;
  int index;
  FILE *dumper;
  bool append_local;
  char *fileDumperName_local;
  bool verbose_local;
  uint64_t *memLeakSize_local;
  size_t *memLeakCount_local;
  MemPlumberInternal *this_local;
  
  *memLeakCount = 0;
  *memLeakSize = 0;
  pFStack_40 = (FILE *)0x0;
  if (verbose) {
    pFStack_40 = (FILE *)openFile(this,fileDumperName,append);
  }
  for (metaDataBucketLinkedListElement._4_4_ = 0; metaDataBucketLinkedListElement._4_4_ < 0x4000;
      metaDataBucketLinkedListElement._4_4_ = metaDataBucketLinkedListElement._4_4_ + 1) {
    local_50 = this->m_PointerListHashtable[metaDataBucketLinkedListElement._4_4_];
    if (local_50 != (new_ptr_list_t *)0x0) {
      for (; local_50 != (new_ptr_list_t *)0x0; local_50 = local_50->next) {
        *memLeakCount = *memLeakCount + 1;
        *memLeakSize = local_50->size + *memLeakSize;
        if (verbose) {
          fprintf(pFStack_40,"Found leaked object at 0x%p (size %d[bytes]) allocated in: %s:%d\n",
                  local_50 + 1,local_50->size & 0xffffffff,local_50->file,
                  (ulong)(uint)local_50->line);
        }
      }
    }
  }
  closeFile(this,(FILE *)pFStack_40);
  return;
}

Assistant:

void checkLeaks(size_t& memLeakCount, uint64_t& memLeakSize, bool verbose, const char* fileDumperName, bool append) {

        memLeakCount = 0;
        memLeakSize = 0;

        FILE* dumper = NULL;
        if (verbose) {
            dumper = openFile(fileDumperName, append);
        }

        // go over all buckets in the hashmap
        for (int index = 0; index < MEMPLUMBER_HASHTABLE_SIZE; ++index) {
            new_ptr_list_t* metaDataBucketLinkedListElement = m_PointerListHashtable[index];

            // if bucket is empty - continue
            if (metaDataBucketLinkedListElement == NULL) {
                continue;
            }

            // go over all of the elements in the link list in this bucket
            while (metaDataBucketLinkedListElement != NULL) {

                memLeakCount++;
                memLeakSize += (uint64_t)metaDataBucketLinkedListElement->size;

                if (verbose) {
                    fprintf(dumper, "Found leaked object at 0x%p (size %d[bytes]) allocated in: %s:%d\n",
                        (char*) metaDataBucketLinkedListElement + sizeof(new_ptr_list_t), 
                        (int) metaDataBucketLinkedListElement->size,
                        metaDataBucketLinkedListElement->file, 
                        metaDataBucketLinkedListElement->line);
                }

                // go to the next item on the list
                metaDataBucketLinkedListElement = metaDataBucketLinkedListElement->next;
            }
        }

        closeFile(dumper);
    }